

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<Fad<double>_>::Diagonal(TPZMatrix<Fad<double>_> *this,Fad<double> *val)

{
  int64_t iVar1;
  int64_t iVar2;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_00000158;
  char *in_stack_00000160;
  Fad<double> *this_00;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> local_40;
  Fad<double> *local_20;
  Fad<double> *local_18;
  
  iVar1 = TPZBaseMatrix::Cols(in_RDI);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar1 != iVar2) {
    Error(in_stack_00000160,in_stack_00000158);
  }
  for (local_18 = (Fad<double> *)0x0; pFVar4 = local_18, iVar1 = TPZBaseMatrix::Rows(in_RDI),
      (long)pFVar4 < iVar1; local_18 = (Fad<double> *)((long)&local_18->val_ + 1)) {
    for (local_20 = (Fad<double> *)0x0; pFVar4 = local_20, iVar1 = TPZBaseMatrix::Cols(in_RDI),
        (long)pFVar4 < iVar1; local_20 = (Fad<double> *)((long)&local_20->val_ + 1)) {
      if (local_18 == local_20) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_18,local_20,in_RSI);
      }
      else {
        pFVar4 = &local_40;
        this_00 = local_18;
        pFVar3 = local_20;
        Fad<double>::Fad<double,_nullptr>(pFVar4,&local_20->val_);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,this_00,pFVar3,pFVar4);
        Fad<double>::~Fad(this_00);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}